

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

ostream * tchecker::clockbounds::operator<<(ostream *os,global_lu_map_t *map)

{
  ostream *poVar1;
  map_t *pmVar2;
  global_lu_map_t *map_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"L=");
  pmVar2 = global_lu_map_t::L(map);
  poVar1 = operator<<(poVar1,pmVar2);
  poVar1 = std::operator<<(poVar1," U=");
  pmVar2 = global_lu_map_t::U(map);
  poVar1 = operator<<(poVar1,pmVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::clockbounds::global_lu_map_t const & map)
{
  return os << "L=" << map.L() << " U=" << map.U() << std::endl;
}